

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O1

size_t fiobj_str_readfile(FIOBJ dest,char *filename,intptr_t start_at,intptr_t limit)

{
  fio_str_s_conflict *s;
  byte bVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  ulong uVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  ulong needed;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  fio_str_info_s local_d8;
  stat local_c0;
  
  if (filename == (char *)0x0) {
    return 0;
  }
  if ((*filename == '~') && ((filename[1] == '\\' || (filename[1] == '/')))) {
    __s = getenv("HOME");
    bVar11 = true;
    if (__s == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar3 = strlen(filename);
      sVar4 = strlen(__s);
      bVar11 = sVar4 + sVar3 < 0x10000;
      if (bVar11) {
        if ((__s[sVar4 - 1] == '\\') || (__s[sVar4 - 1] == '/')) {
          sVar4 = sVar4 - 1;
        }
        __dest = (char *)fio_malloc(sVar4 + sVar3);
        if (__dest == (char *)0x0) {
          if (0 < FIO_LOG_LEVEL) {
            FIO_LOG2STDERR(
                          "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.h:4497"
                          );
          }
          kill(0,2);
          piVar6 = __errno_location();
          exit(*piVar6);
        }
        memcpy(__dest,__s,sVar4);
        memcpy(__dest + sVar4,filename + 1,sVar3);
        __dest[(sVar4 + sVar3) - 1] = '\0';
        bVar11 = true;
        filename = __dest;
      }
      else {
        __dest = (char *)0x0;
      }
    }
    if (!bVar11) {
      return 0;
    }
  }
  else {
    __dest = (char *)0x0;
  }
  iVar2 = stat(filename,&local_c0);
  if (iVar2 != 0) {
    uVar5 = 0;
    goto LAB_001205c3;
  }
  uVar9 = dest & 0xfffffffffffffff8;
  s = (fio_str_s_conflict *)(uVar9 + 0x10);
  if (local_c0.st_size < 1 || local_c0.st_size <= start_at) {
    if ((s->small == 0) && (*(long *)(uVar9 + 0x38) != 0)) {
      uVar5 = *(ulong *)(uVar9 + 0x28);
    }
    else {
      uVar5 = (ulong)(s->small >> 1);
    }
    goto LAB_001205c3;
  }
  uVar5 = 0;
  iVar2 = open(filename,0);
  if (iVar2 == -1) goto LAB_001205c3;
  lVar10 = 0;
  if (0 < local_c0.st_size + start_at) {
    lVar10 = local_c0.st_size + start_at;
  }
  if (-1 < start_at) {
    lVar10 = start_at;
  }
  sVar3 = limit;
  if (local_c0.st_size < lVar10 + limit) {
    sVar3 = local_c0.st_size - lVar10;
  }
  if (limit < 1) {
    sVar3 = local_c0.st_size - lVar10;
  }
  bVar1 = s->small;
  if ((bVar1 == 0) && (*(long *)(uVar9 + 0x38) != 0)) {
    needed = *(ulong *)(uVar9 + 0x28);
  }
  else {
    needed = (ulong)(bVar1 >> 1);
  }
  if (*(char *)(uVar9 + 0x11) == '\0') {
    uVar5 = needed + sVar3;
    if ((bVar1 == 0) && (*(long *)(uVar9 + 0x38) != 0)) {
      uVar7 = *(ulong *)(uVar9 + 0x20);
      if (uVar7 <= uVar5) {
        if (*(long *)(uVar9 + 0x30) == 0) {
          uVar7 = *(ulong *)(uVar9 + 0x28);
        }
        *(ulong *)(uVar9 + 0x28) = uVar7;
        fio_str_capa_assert(&local_d8,s,uVar5);
      }
    }
    else {
      if (uVar5 < 0x2e) {
        *(char *)(uVar9 + 0x10) = (char)uVar5 * '\x02' + '\x01';
        lVar8 = uVar9 + 0x12;
        *(undefined1 *)(uVar9 + 0x12 + uVar5) = 0;
        goto LAB_00120775;
      }
      s->small = '[';
      fio_str_capa_assert(&local_d8,s,uVar5);
    }
    *(ulong *)(uVar9 + 0x28) = uVar5;
    *(undefined1 *)(*(long *)(uVar9 + 0x38) + uVar5) = 0;
    lVar8 = *(long *)(uVar9 + 0x38);
  }
  else if ((bVar1 == 0) && (lVar8 = *(long *)(uVar9 + 0x38), lVar8 != 0)) {
    uVar5 = *(ulong *)(uVar9 + 0x28);
  }
  else {
    uVar5 = (ulong)(bVar1 >> 1);
    lVar8 = uVar9 + 0x12;
  }
LAB_00120775:
  sVar4 = pread(iVar2,(void *)(lVar8 + needed),sVar3,lVar10);
  if (sVar4 != sVar3) {
    if (*(char *)(uVar9 + 0x11) == '\0') {
      if ((s->small == '\0') && (*(long *)(uVar9 + 0x38) != 0)) {
        uVar5 = *(ulong *)(uVar9 + 0x20);
        if (uVar5 <= needed) {
          if (*(long *)(uVar9 + 0x30) == 0) {
            uVar5 = *(ulong *)(uVar9 + 0x28);
          }
          *(ulong *)(uVar9 + 0x28) = uVar5;
LAB_001207df:
          fio_str_capa_assert(&local_d8,s,needed);
        }
        *(ulong *)(uVar9 + 0x28) = needed;
        lVar10 = *(long *)(uVar9 + 0x38);
      }
      else {
        if (0x2d < needed) {
          s->small = '[';
          goto LAB_001207df;
        }
        *(char *)(uVar9 + 0x10) = (char)needed * '\x02' + '\x01';
        lVar10 = uVar9 + 0x12;
      }
      *(undefined1 *)(lVar10 + needed) = 0;
    }
    uVar5 = 0;
  }
  close(iVar2);
LAB_001205c3:
  fio_free(__dest);
  return uVar5;
}

Assistant:

size_t fiobj_str_readfile(FIOBJ dest, const char *filename, intptr_t start_at,
                          intptr_t limit) {
  fio_str_info_s state =
      fio_str_readfile(&obj2str(dest)->str, filename, start_at, limit);
  return state.len;
}